

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>
rectangleFromVertices(Vector3 *pA,Vector3 *pB,Vector3 *pC)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Rectangle *this;
  undefined8 *in_RCX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  Vector3 local_60;
  Vector3 local_50;
  Vector3 local_40;
  
  uVar1 = pC->x;
  uVar3 = pC->y;
  uVar2 = pB->x;
  uVar4 = pB->y;
  local_40.x = (float)uVar1 - (float)uVar2;
  local_40.y = (float)uVar3 - (float)uVar4;
  fVar7 = pB->z;
  local_50.x = (float)*in_RCX - (float)uVar2;
  local_50.y = (float)((ulong)*in_RCX >> 0x20) - (float)uVar4;
  local_60.z = local_40.x * local_50.y - local_40.y * local_50.x;
  local_50.z = *(float *)(in_RCX + 1) - fVar7;
  local_40.z = pC->z - fVar7;
  auVar5._0_4_ = local_40.y * local_50.z - local_50.y * local_40.z;
  auVar5._4_4_ = local_50.x * local_40.z - local_50.z * local_40.x;
  auVar5._8_4_ = (0.0 - fVar7) * 0.0 - local_50.y * (0.0 - fVar7);
  auVar5._12_4_ = (0.0 - fVar7) * 0.0 - local_40.z * (0.0 - fVar7);
  fVar7 = SQRT(local_60.z * local_60.z + auVar5._0_4_ * auVar5._0_4_ + auVar5._4_4_ * auVar5._4_4_);
  local_60.z = local_60.z / fVar7;
  auVar6._4_4_ = fVar7;
  auVar6._0_4_ = fVar7;
  auVar6._8_4_ = local_40.y;
  auVar6._12_4_ = local_40.y;
  auVar6 = divps(auVar5,auVar6);
  local_60._0_8_ = auVar6._0_8_;
  this = (Rectangle *)operator_new(0x70);
  pm::Rectangle::Rectangle(this,pB,&local_40,&local_50,&local_60);
  *(Rectangle **)pA = this;
  return (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)
         (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)pA;
}

Assistant:

std::unique_ptr<pm::Rectangle> rectangleFromVertices(const pm::Vector3 pA, const pm::Vector3 pB, const pm::Vector3 pC)
{
	auto rect = std::make_unique<pm::Rectangle>(pA, pB - pA, pC - pA, cross(pB - pA, pC - pA).normalize());
	return rect;
}